

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isCubeLevelSampleResultValid
               (ConstPixelBufferAccess (*level) [6],Sampler *sampler,FilterMode filterMode,
               LookupPrecision *prec,CubeFaceFloatCoords *coords,Vec4 *result)

{
  TextureFormat *pTVar1;
  undefined8 result_00;
  CubeFaceFloatCoords *pCVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  float fVar7;
  ulong uVar8;
  Sampler *sampler_00;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  CubeFaceIntCoords CVar15;
  CubeFaceIntCoords CVar16;
  ColorQuad quad;
  Vec2 vBounds;
  Vec2 uBounds;
  bool local_181;
  float local_17c;
  Vec2 local_178;
  int aiStack_170 [4];
  ulong local_160;
  TextureChannelClass local_158;
  int local_154;
  int local_150;
  int local_14c;
  ulong local_148;
  ulong local_140;
  int local_134;
  int local_130;
  float local_12c;
  ConstPixelBufferAccess (*local_128) [6];
  undefined1 local_120 [24];
  Sampler *local_108;
  void *local_100;
  ulong local_f8;
  CubeFaceFloatCoords *local_f0;
  float local_e8;
  float local_e4;
  int local_e0;
  int local_dc;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  float afStack_c0 [2];
  float local_b8 [2];
  float afStack_b0 [2];
  float local_a8 [2];
  float afStack_a0 [2];
  LookupPrecision *local_98;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  ulong local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (filterMode == LINEAR) {
    if (sampler->seamlessCubeMap == true) {
      iVar6 = (*level)[coords->face].m_size.m_data[0];
      local_f0 = coords;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_88,sampler->normalizedCoords,iVar6,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      local_108 = sampler;
      local_e0 = iVar6;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_90,sampler->normalizedCoords,iVar6,local_f0->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      fVar10 = floorf(local_88 + -0.5);
      local_140 = CONCAT44(local_140._4_4_,fVar10);
      fVar10 = floorf(local_84 + -0.5);
      local_148 = CONCAT44(local_148._4_4_,fVar10);
      fVar10 = floorf(local_90 + -0.5);
      fVar10 = (float)(int)fVar10;
      fVar11 = floorf(local_8c + -0.5);
      local_134 = (int)fVar11;
      local_128 = level;
      local_158 = getTextureChannelClass((*level)[local_f0->face].m_format.type);
      if (local_158 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
        local_17c = computeBilinearSearchStepForSnorm(prec);
      }
      else {
        local_17c = 0.0;
        if (local_158 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
          local_17c = computeBilinearSearchStepForUnorm(prec);
        }
      }
      local_181 = (int)fVar10 <= local_134;
      if ((int)fVar10 <= local_134) {
        local_e8 = (float)(int)(float)local_140;
        local_130 = (int)(float)local_148;
        local_181 = true;
        local_12c = fVar10;
        local_120._16_8_ = result;
        local_98 = prec;
        do {
          local_80 = (ulong)(uint)local_12c;
          local_e4 = (float)(int)local_12c;
          fVar10 = local_e8;
          local_12c = (float)((int)local_12c + 1);
          do {
            iVar6 = local_e0;
            pCVar2 = local_f0;
            fVar11 = fVar10;
            if (local_130 < (int)fVar10) break;
            local_d8._4_4_ = fVar10;
            local_d8._0_4_ = local_f0->face;
            fVar11 = (float)local_80;
            local_d8._8_4_ = fVar11;
            CVar15 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_d8,local_e0);
            local_dc = CVar15.t;
            local_148 = CVar15._0_8_;
            fVar7 = (float)((int)fVar10 + 1);
            local_d8._4_4_ = fVar7;
            local_d8._0_4_ = pCVar2->face;
            local_d8._8_4_ = fVar11;
            CVar15 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_d8,iVar6);
            fVar11 = local_12c;
            local_150 = CVar15.t;
            local_140 = CVar15._0_8_;
            local_d8._4_4_ = fVar10;
            local_d8._0_4_ = pCVar2->face;
            local_d8._8_4_ = local_12c;
            local_160 = (ulong)(uint)fVar10;
            CVar15 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_d8,iVar6);
            local_14c = CVar15.t;
            uVar4 = CVar15._0_8_;
            local_d8._4_4_ = fVar7;
            local_d8._0_4_ = pCVar2->face;
            local_d8._8_4_ = fVar11;
            CVar16 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_d8,iVar6);
            sampler_00 = local_108;
            uVar5 = local_148 & 0xffffffff;
            bVar3 = false;
            if ((uVar5 == 6) || (CVar15.face == CUBEFACE_LAST)) {
LAB_019f4565:
              fVar11 = (float)local_160;
            }
            else {
              uVar9 = local_140 & 0xffffffff;
              if (((float)local_140 == 8.40779e-45) ||
                 (uVar8 = CVar16._0_8_ & 0xffffffff, CVar16.face == CUBEFACE_LAST))
              goto LAB_019f4565;
              local_48 = ZEXT416((uint)(local_88 + -0.5));
              local_58 = ZEXT416((uint)(local_84 + -0.5));
              local_68 = ZEXT416((uint)(local_90 + -0.5));
              local_78 = ZEXT416((uint)(local_8c + -0.5));
              local_a8[0] = 0.0;
              local_a8[1] = 0.0;
              afStack_a0[0] = 0.0;
              afStack_a0[1] = 0.0;
              local_b8[0] = 0.0;
              local_b8[1] = 0.0;
              afStack_b0[0] = 0.0;
              afStack_b0[1] = 0.0;
              local_c8._0_4_ = 0.0;
              local_c8._4_4_ = 0.0;
              afStack_c0[0] = 0.0;
              afStack_c0[1] = 0.0;
              local_d8._0_4_ = 0.0;
              local_d8._4_4_ = 0.0;
              local_d8._8_4_ = 0.0;
              local_d8._12_4_ = 0.0;
              pTVar1 = &(*local_128)[uVar5].m_format;
              local_154 = CVar16.t;
              local_100 = (void *)(uVar4 & 0xffffffff);
              local_f8 = uVar8;
              if (((((long)local_148 < 0) ||
                   (iVar6 = (int)(local_148 >> 0x20), (*local_128)[uVar5].m_size.m_data[0] <= iVar6)
                   ) || (local_dc < 0)) ||
                 (((int)pTVar1[1].type <= local_dc || ((int)pTVar1[2].order < 1)))) {
                sampleTextureBorder<float>((tcu *)&local_178,pTVar1,local_108);
              }
              else {
                local_148 = uVar4;
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_120,(int)pTVar1,iVar6,local_dc);
                bVar3 = isSRGB(*pTVar1);
                if (bVar3) {
                  sRGBToLinear((tcu *)&local_178,(Vec4 *)local_120);
                  uVar4 = local_148;
                  sampler_00 = local_108;
                }
                else {
                  local_178.m_data[1] = (float)local_120._4_4_;
                  local_178.m_data[0] = (float)local_120._0_4_;
                  aiStack_170[0] = local_120._8_4_;
                  aiStack_170[1] = local_120._12_4_;
                  uVar4 = local_148;
                  sampler_00 = local_108;
                }
              }
              local_d8._0_4_ = local_178.m_data[0];
              local_d8._4_4_ = local_178.m_data[1];
              local_d8._8_4_ = aiStack_170[0];
              local_d8._12_4_ = aiStack_170[1];
              pTVar1 = &(*local_128)[uVar9].m_format;
              if ((((long)local_140 < 0) ||
                  (iVar6 = (int)(local_140 >> 0x20), (*local_128)[uVar9].m_size.m_data[0] <= iVar6))
                 || ((local_150 < 0 ||
                     (((int)pTVar1[1].type <= local_150 || ((int)pTVar1[2].order < 1)))))) {
                sampleTextureBorder<float>((tcu *)&local_178,pTVar1,sampler_00);
              }
              else {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_120,(int)pTVar1,iVar6,local_150);
                bVar3 = isSRGB(*pTVar1);
                if (bVar3) {
                  sRGBToLinear((tcu *)&local_178,(Vec4 *)local_120);
                }
                else {
                  local_178.m_data[1] = (float)local_120._4_4_;
                  local_178.m_data[0] = (float)local_120._0_4_;
                  aiStack_170[0] = local_120._8_4_;
                  aiStack_170[1] = local_120._12_4_;
                }
              }
              local_b8[0] = local_178.m_data[0];
              local_b8[1] = local_178.m_data[1];
              afStack_b0[0] = (float)aiStack_170[0];
              afStack_b0[1] = (float)aiStack_170[1];
              pTVar1 = &(*local_128)[(long)local_100].m_format;
              if (((((long)uVar4 < 0) ||
                   (iVar6 = (int)(uVar4 >> 0x20),
                   (*local_128)[(long)local_100].m_size.m_data[0] <= iVar6)) || (local_14c < 0)) ||
                 (((int)pTVar1[1].type <= local_14c || ((int)pTVar1[2].order < 1)))) {
                sampleTextureBorder<float>((tcu *)&local_178,pTVar1,sampler_00);
              }
              else {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_120,(int)pTVar1,iVar6,local_14c);
                bVar3 = isSRGB(*pTVar1);
                if (bVar3) {
                  sRGBToLinear((tcu *)&local_178,(Vec4 *)local_120);
                }
                else {
                  local_178.m_data[1] = (float)local_120._4_4_;
                  local_178.m_data[0] = (float)local_120._0_4_;
                  aiStack_170[0] = local_120._8_4_;
                  aiStack_170[1] = local_120._12_4_;
                }
              }
              result_00 = local_120._16_8_;
              local_c8._0_4_ = local_178.m_data[0];
              local_c8._4_4_ = local_178.m_data[1];
              afStack_c0[0] = (float)aiStack_170[0];
              afStack_c0[1] = (float)aiStack_170[1];
              pTVar1 = &(*local_128)[local_f8].m_format;
              if ((((long)CVar16._0_8_ < 0) || ((*local_128)[local_f8].m_size.m_data[0] <= CVar16.s)
                  ) || ((local_154 < 0 ||
                        (((int)pTVar1[1].type <= local_154 || ((int)pTVar1[2].order < 1)))))) {
                sampleTextureBorder<float>((tcu *)&local_178,pTVar1,sampler_00);
              }
              else {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_120,(int)pTVar1,CVar16.s,local_154);
                bVar3 = isSRGB(*pTVar1);
                if (bVar3) {
                  sRGBToLinear((tcu *)&local_178,(Vec4 *)local_120);
                }
                else {
                  local_178.m_data[1] = (float)local_120._4_4_;
                  local_178.m_data[0] = (float)local_120._0_4_;
                  aiStack_170[0] = local_120._8_4_;
                  aiStack_170[1] = local_120._12_4_;
                }
              }
              fVar11 = (float)local_160;
              local_a8[0] = local_178.m_data[0];
              local_a8[1] = local_178.m_data[1];
              afStack_a0[0] = (float)aiStack_170[0];
              afStack_a0[1] = (float)aiStack_170[1];
              if (local_158 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                local_17c = computeBilinearSearchStepFromFloatQuad(local_98,(ColorQuad *)local_d8);
              }
              fVar10 = (float)local_48._0_4_ - (float)(int)fVar11;
              local_120._0_4_ = 1.0;
              if (fVar10 <= 1.0) {
                local_120._0_4_ = fVar10;
              }
              local_120._0_4_ = ~-(uint)(fVar10 < 0.0) & local_120._0_4_;
              fVar10 = (float)local_58._0_4_ - (float)(int)fVar11;
              local_120._4_4_ = 1.0;
              if (fVar10 <= 1.0) {
                local_120._4_4_ = fVar10;
              }
              local_120._4_4_ = ~-(uint)(fVar10 < 0.0) & local_120._4_4_;
              fVar13 = (float)local_68._0_4_ - local_e4;
              fVar10 = 1.0;
              if (fVar13 <= 1.0) {
                fVar10 = fVar13;
              }
              fVar14 = (float)local_78._0_4_ - local_e4;
              fVar12 = 1.0;
              if (fVar14 <= 1.0) {
                fVar12 = fVar14;
              }
              local_178.m_data[1] = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar12);
              local_178.m_data[0] = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar10);
              bVar3 = isBilinearRangeValid
                                (local_98,(ColorQuad *)local_d8,(Vec2 *)local_120,&local_178,
                                 local_17c,(Vec4 *)result_00);
              bVar3 = !bVar3;
            }
            fVar10 = fVar7;
          } while (bVar3);
        } while ((local_130 < (int)fVar11) &&
                (local_181 = (int)local_12c <= local_134, (int)local_12c <= local_134));
      }
    }
    else {
      local_d8._0_4_ = coords->s;
      local_d8._4_4_ = coords->t;
      local_181 = isLinearSampleResultValid
                            (*level + coords->face,sampler,prec,(Vec2 *)local_d8,0,result);
    }
  }
  else {
    local_d8._0_4_ = coords->s;
    local_d8._4_4_ = coords->t;
    local_181 = isNearestSampleResultValid<tcu::LookupPrecision,float>
                          (*level + coords->face,sampler,prec,(Vec2 *)local_d8,0,result);
  }
  return local_181;
}

Assistant:

static bool isCubeLevelSampleResultValid (const ConstPixelBufferAccess		(&level)[CUBEFACE_LAST],
										  const Sampler&					sampler,
										  const Sampler::FilterMode			filterMode,
										  const LookupPrecision&			prec,
										  const CubeFaceFloatCoords&		coords,
										  const Vec4&						result)
{
	if (filterMode == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamlessLinearSampleResultValid(level, sampler, prec, coords, result);
		else
			return isLinearSampleResultValid(level[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, result);
	}
	else
		return isNearestSampleResultValid(level[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, result);
}